

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<std::vector<std::pair<phmap::priv::hash_internal::EnumClass,int>,std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,int>>>const&>
::
UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<std::pair<phmap::priv::hash_internal::EnumClass,int>const&>*,std::vector<testing::Matcher<std::pair<phmap::priv::hash_internal::EnumClass,int>const&>,std::allocator<testing::Matcher<std::pair<phmap::priv::hash_internal::EnumClass,int>const&>>>>>
          (UnorderedElementsAreMatcherImpl<std::vector<std::pair<phmap::priv::hash_internal::EnumClass,int>,std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,int>>>const&>
           *this,Flags matcher_flags,
          __normal_iterator<testing::Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>_*,_std::vector<testing::Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>_>_>_>
          first,__normal_iterator<testing::Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>_*,_std::vector<testing::Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>,_std::allocator<testing::Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>_>_>_>
                last)

{
  long lVar1;
  Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&> *m;
  long lVar2;
  MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&> local_48;
  
  *(Flags *)(this + 8) = matcher_flags;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined ***)this = &PTR__UnorderedElementsAreMatcherImpl_00346a18;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  if (first._M_current != last._M_current) {
    do {
      local_48.vtable_ =
           ((first._M_current)->
           super_MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>).vtable_
      ;
      local_48.buffer_ =
           (Buffer)((first._M_current)->
                   super_MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>)
                   .buffer_.shared;
      if ((local_48.vtable_ != (VTable *)0x0) &&
         ((local_48.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
        LOCK();
        ((local_48.buffer_.shared)->ref).super___atomic_base<int>._M_i =
             ((local_48.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherBase_00346aa0;
      std::
      vector<testing::Matcher<std::pair<phmap::priv::hash_internal::EnumClass,int>const&>,std::allocator<testing::Matcher<std::pair<phmap::priv::hash_internal::EnumClass,int>const&>>>
      ::emplace_back<testing::Matcher<std::pair<phmap::priv::hash_internal::EnumClass,int>const&>>
                ((vector<testing::Matcher<std::pair<phmap::priv::hash_internal::EnumClass,int>const&>,std::allocator<testing::Matcher<std::pair<phmap::priv::hash_internal::EnumClass,int>const&>>>
                  *)(this + 0x28),
                 (Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&> *)&local_48
                );
      MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>::~MatcherBase
                (&local_48);
      first._M_current = first._M_current + 1;
    } while (first._M_current != last._M_current);
    lVar2 = *(long *)(this + 0x28);
    lVar1 = *(long *)(this + 0x30);
    if (lVar2 != lVar1) {
      do {
        if (*(long *)(lVar2 + 8) == 0) {
          local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
               (_func_int **)0x0;
        }
        else {
          local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
               (_func_int **)(**(code **)(*(long *)(lVar2 + 8) + 0x10))(lVar2);
        }
        std::
        vector<testing::MatcherDescriberInterface_const*,std::allocator<testing::MatcherDescriberInterface_const*>>
        ::emplace_back<testing::MatcherDescriberInterface_const*>
                  ((vector<testing::MatcherDescriberInterface_const*,std::allocator<testing::MatcherDescriberInterface_const*>>
                    *)(this + 0x10),(MatcherDescriberInterface **)&local_48);
        lVar2 = lVar2 + 0x18;
      } while (lVar2 != lVar1);
    }
  }
  return;
}

Assistant:

UnorderedElementsAreMatcherImpl(UnorderedMatcherRequire::Flags matcher_flags,
                                  InputIter first, InputIter last)
      : UnorderedElementsAreMatcherImplBase(matcher_flags) {
    for (; first != last; ++first) {
      matchers_.push_back(MatcherCast<const Element&>(*first));
    }
    for (const auto& m : matchers_) {
      matcher_describers().push_back(m.GetDescriber());
    }
  }